

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::addLagrangeTerm
          (OptimalControlProblem *this,double weight,
          shared_ptr<iDynTree::optimalcontrol::QuadraticCost> *quadraticCost)

{
  byte bVar1;
  string *in_stack_00000610;
  undefined1 in_stack_0000061e;
  undefined1 in_stack_0000061f;
  shared_ptr<iDynTree::optimalcontrol::Cost> *in_stack_00000620;
  TimeRange *in_stack_00000628;
  double in_stack_00000630;
  OptimalControlProblemPimpl *in_stack_00000638;
  shared_ptr<iDynTree::optimalcontrol::QuadraticCost> *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  
  TimeRange::AnyTime();
  std::shared_ptr<iDynTree::optimalcontrol::Cost>::
  shared_ptr<iDynTree::optimalcontrol::QuadraticCost,void>
            ((shared_ptr<iDynTree::optimalcontrol::Cost> *)
             CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  bVar1 = OptimalControlProblemPimpl::addCost
                    (in_stack_00000638,in_stack_00000630,in_stack_00000628,in_stack_00000620,
                     (bool)in_stack_0000061f,(bool)in_stack_0000061e,in_stack_00000610);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
  std::shared_ptr<iDynTree::optimalcontrol::Cost>::~shared_ptr
            ((shared_ptr<iDynTree::optimalcontrol::Cost> *)0x2fabaf);
  return (bool)(bVar1 & 1);
}

Assistant:

bool OptimalControlProblem::addLagrangeTerm(double weight, std::shared_ptr<QuadraticCost> quadraticCost)
        {
            return (m_pimpl->addCost(weight, TimeRange::AnyTime(), quadraticCost, false, true, "addLagrangeTerm"));
        }